

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35d0fd::CommandTask::inputsAvailable(CommandTask *this,TaskInterface ti)

{
  Command *pCVar1;
  int iVar2;
  anon_class_24_2_e88081f0 fn;
  DetachedContext ctx;
  anon_class_24_2_e88081f0 local_90;
  TaskInterface local_78;
  undefined8 *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  QueueJob local_48;
  
  local_90.ti.ctx = ti.ctx;
  local_90.ti.impl = ti.impl;
  local_90.this = this;
  local_78.impl = local_90.ti.impl;
  local_78.ctx = local_90.ti.ctx;
  iVar2 = (*(this->command->super_JobDescriptor)._vptr_JobDescriptor[0x13])();
  if ((char)iVar2 == '\0') {
    pCVar1 = this->command;
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68 = (undefined8 *)0x0;
    uStack_60 = 0;
    local_68 = (undefined8 *)operator_new(0x18);
    *local_68 = local_90.this;
    local_68[1] = local_90.ti.impl;
    local_68[2] = local_90.ti.ctx;
    pcStack_50 = std::
                 _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1561:15)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1561:15)>
               ::_M_manager;
    local_48.work.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_48.work.super__Function_base._M_functor._8_8_ = 0;
    local_48.work.super__Function_base._M_manager = (_Manager_type)0x0;
    local_48.work._M_invoker = (_Invoker_type)0x0;
    local_48.desc = &pCVar1->super_JobDescriptor;
    local_48.work.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
    *(CommandTask **)local_48.work.super__Function_base._M_functor._M_unused._0_8_ = local_90.this;
    *(void **)((long)local_48.work.super__Function_base._M_functor._M_unused._0_8_ + 8) =
         local_90.ti.impl;
    *(void **)((long)local_48.work.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         local_90.ti.ctx;
    local_48.work._M_invoker =
         std::
         _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1561:15)>
         ::_M_invoke;
    local_48.work.super__Function_base._M_manager =
         std::
         _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1561:15)>
         ::_M_manager;
    llbuild::core::TaskInterface::spawn(&local_78,&local_48,Normal);
    if (local_48.work.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_48.work.super__Function_base._M_manager)
                ((_Any_data *)&local_48.work,(_Any_data *)&local_48.work,__destroy_functor);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
  }
  else {
    local_48.desc = (JobDescriptor *)&PTR__QueueJobContext_00243440;
    inputsAvailable::anon_class_24_2_e88081f0::operator()(&local_90,(QueueJobContext *)&local_48);
    llbuild::basic::QueueJobContext::~QueueJobContext((QueueJobContext *)&local_48);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    auto fn = [this, ti](QueueJobContext* context) mutable {
      // If the build should cancel, do nothing.
      if (ti.isCancelled()) {
        ti.complete(BuildValue::makeCancelledCommand().toData());
        return;
      }

      // Check if the command should be skipped.
      if (!getBuildSystem(ti).getDelegate().shouldCommandStart(&command)) {
        // We need to call commandFinished here because commandPreparing and
        // shouldCommandStart guarantee that they're followed by
        // commandFinished.
        getBuildSystem(ti).getDelegate().commandFinished(&command, ProcessStatus::Skipped);
        ti.complete(BuildValue::makeSkippedCommand().toData());
        return;
      }
    
      // Execute the command, with notifications to the delegate.
      command.execute(getBuildSystem(ti).getBuildSystem(), ti, context, [ti](BuildValue&& result) mutable {
        // Inform the engine of the result.
        if (result.isFailedCommand()) {
          getBuildSystem(ti).getDelegate().hadCommandFailure();
        }
        ti.complete(result.toData());
      });
    };
    if (command.isDetached()) {
      struct DetachedContext: public QueueJobContext {
        unsigned laneID() const override { return -1; }
      };
      DetachedContext ctx;
      fn(&ctx);
    } else {
      ti.spawn({ &command, std::move(fn) });
    }
  }